

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_free(wally_psbt *psbt)

{
  ulong local_18;
  size_t i;
  wally_psbt *psbt_local;
  
  if (psbt != (wally_psbt *)0x0) {
    wally_tx_free(psbt->tx);
    for (local_18 = 0; local_18 < psbt->num_inputs; local_18 = local_18 + 1) {
      psbt_input_free(psbt->inputs + local_18,false);
    }
    wally_free(psbt->inputs);
    for (local_18 = 0; local_18 < psbt->num_outputs; local_18 = local_18 + 1) {
      psbt_output_free(psbt->outputs + local_18,false);
    }
    wally_free(psbt->outputs);
    wally_map_clear(&psbt->unknowns);
    clear_and_free(psbt,0x60);
  }
  return 0;
}

Assistant:

int wally_psbt_free(struct wally_psbt *psbt)
{
    size_t i;
    if (psbt) {
        wally_tx_free(psbt->tx);
        for (i = 0; i < psbt->num_inputs; ++i)
            psbt_input_free(&psbt->inputs[i], false);

        wally_free(psbt->inputs);
        for (i = 0; i < psbt->num_outputs; ++i)
            psbt_output_free(&psbt->outputs[i], false);

        wally_free(psbt->outputs);
        wally_map_clear(&psbt->unknowns);
        clear_and_free(psbt, sizeof(*psbt));
    }
    return WALLY_OK;
}